

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive8.cpp
# Opt level: O2

size_t __thiscall embree::CurveNiMB<8>::Type::getBytes(Type *this,char *This)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  
  bVar1 = *This;
  uVar2 = (**(code **)((long)*this + 8))();
  if ((bVar1 & 0x1c) == 0) {
    sVar5 = (uVar2 + 7 >> 3) * 0x60;
  }
  else {
    uVar3 = (ulong)((uint)uVar2 & 7);
    lVar4 = uVar3 * 0x25 + 0x1e;
    if (uVar3 == 0) {
      lVar4 = 0;
    }
    sVar5 = lVar4 + (uVar2 >> 3) * 0x146;
  }
  return sVar5;
}

Assistant:

size_t Curve8iMB::Type::getBytes(const char* This) const
  {
    if ((*This & Geometry::GType::GTY_BASIS_MASK) == Geometry::GType::GTY_BASIS_LINEAR)
       return Line8i::bytes(sizeActive(This));
     else
       return Curve8iMB::bytes(sizeActive(This));
  }